

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileUtilityTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileUtilityTargetGenerator::WriteRuleFiles(cmMakefileUtilityTargetGenerator *this)

{
  cmMakefile *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmGeneratorTarget *pcVar2;
  cmGeneratedFileStream *os;
  bool bVar3;
  Encoding EVar4;
  ostream *poVar5;
  string *psVar6;
  string *psVar7;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar8;
  char *pcVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string dependTimestamp;
  string dependFile;
  cmGeneratedFileStream depFileStream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  cmGeneratedFileStream local_288;
  
  cmMakefileTargetGenerator::CreateRuleFile(&this->super_cmMakefileTargetGenerator);
  poVar5 = std::operator<<((ostream *)
                           (this->super_cmMakefileTargetGenerator).BuildFileStream._M_t.
                           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                           "# Utility rule file for ");
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  poVar5 = std::operator<<(poVar5,(string *)psVar6);
  std::operator<<(poVar5,".\n\n");
  this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"CMAKE_MAKE_INCLUDE_FROM_ROOT",(allocator<char> *)&local_2a8);
  bVar3 = cmMakefile::IsOn(this_00,(string *)&local_288);
  pcVar9 = "";
  if (bVar3) {
    pcVar9 = "$(CMAKE_BINARY_DIR)/";
  }
  std::__cxx11::string::~string((string *)&local_288);
  psVar6 = &(this->super_cmMakefileTargetGenerator).TargetBuildDirectoryFull;
  cmStrCat<std::__cxx11::string&,char_const(&)[22]>
            (&local_2a8,psVar6,(char (*) [22])"/compiler_depend.make");
  poVar5 = std::operator<<((ostream *)
                           (this->super_cmMakefileTargetGenerator).BuildFileStream._M_t.
                           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                           "# Include any custom commands dependencies for this target.\n");
  poVar5 = std::operator<<(poVar5,(string *)
                                  &((this->super_cmMakefileTargetGenerator).GlobalGenerator)->
                                   IncludeDirective);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,pcVar9);
  cmOutputConverter::MaybeRelativeToTopBinDir
            (&local_2c8,(cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
             &local_2a8);
  cmSystemTools::ConvertToOutputPath((string *)&local_288,&local_2c8);
  poVar5 = std::operator<<(poVar5,(string *)&local_288);
  std::operator<<(poVar5,"\n\n");
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2c8);
  bVar3 = cmsys::SystemTools::FileExists(&local_2a8);
  if (!bVar3) {
    EVar4 = (*(((this->super_cmMakefileTargetGenerator).GlobalGenerator)->
              super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream(&local_288,&local_2a8,false,EVar4);
    poVar5 = std::operator<<((ostream *)&local_288,
                             "# Empty custom commands generated dependencies file for ");
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    poVar5 = std::operator<<(poVar5,(string *)psVar7);
    poVar5 = std::operator<<(poVar5,".\n");
    std::operator<<(poVar5,"# This may be replaced when dependencies are built.\n");
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_288);
  }
  cmStrCat<std::__cxx11::string&,char_const(&)[20]>
            (&local_2c8,psVar6,(char (*) [20])"/compiler_depend.ts");
  bVar3 = cmsys::SystemTools::FileExists(&local_2c8);
  if (!bVar3) {
    EVar4 = (*(((this->super_cmMakefileTargetGenerator).GlobalGenerator)->
              super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream(&local_288,&local_2c8,false,EVar4);
    poVar5 = std::operator<<((ostream *)&local_288,"# CMAKE generated file: DO NOT EDIT!\n");
    poVar5 = std::operator<<(poVar5,
                             "# Timestamp file for custom commands dependencies management for ");
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,".\n");
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_288);
  }
  if ((this->super_cmMakefileTargetGenerator).NoRuleMessages == false) {
    poVar5 = std::operator<<((ostream *)
                             (this->super_cmMakefileTargetGenerator).BuildFileStream._M_t.
                             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                             "# Include the progress variables for this target.\n");
    poVar5 = std::operator<<(poVar5,(string *)
                                    &((this->super_cmMakefileTargetGenerator).GlobalGenerator)->
                                     IncludeDirective);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,pcVar9);
    cmOutputConverter::MaybeRelativeToTopBinDir
              (&local_2e8,
               (cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
               &(this->super_cmMakefileTargetGenerator).ProgressFileNameFull);
    cmSystemTools::ConvertToOutputPath((string *)&local_288,&local_2e8);
    poVar5 = std::operator<<(poVar5,(string *)&local_288);
    std::operator<<(poVar5,"\n\n");
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2e8);
  }
  cmMakefileTargetGenerator::WriteTargetBuildRules(&this->super_cmMakefileTargetGenerator);
  local_2e8.field_2._M_allocated_capacity = 0;
  local_308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8._M_dataplus._M_p = (pointer)0x0;
  local_2e8._M_string_length = 0;
  local_308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar8 = cmGeneratorTarget::GetPreBuildCommands
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  cmLocalUnixMakefileGenerator3::AppendCustomDepends(pcVar1,&local_308,pvVar8);
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar8 = cmGeneratorTarget::GetPostBuildCommands
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  cmLocalUnixMakefileGenerator3::AppendCustomDepends(pcVar1,&local_308,pvVar8);
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar8 = cmGeneratorTarget::GetPreBuildCommands
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmLocalUnixMakefileGenerator3::AppendCustomCommands
            (pcVar1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2e8,pvVar8,pcVar2,psVar6);
  cmMakefileTargetGenerator::DriveCustomCommands(&this->super_cmMakefileTargetGenerator,&local_308);
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar8 = cmGeneratorTarget::GetPostBuildCommands
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmLocalUnixMakefileGenerator3::AppendCustomCommands
            (pcVar1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2e8,pvVar8,pcVar2,psVar6);
  cmMakefileTargetGenerator::AppendTargetDepends
            (&this->super_cmMakefileTargetGenerator,&local_308,false);
  cmLocalUnixMakefileGenerator3::AppendRuleDepend
            ((this->super_cmMakefileTargetGenerator).LocalGenerator,&local_308,
             (this->super_cmMakefileTargetGenerator).BuildFileNameFull._M_dataplus._M_p);
  if ((local_308.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_308.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (local_2e8._M_dataplus._M_p == (pointer)local_2e8._M_string_length)) {
    std::__cxx11::string::string
              ((string *)&local_288,
               (string *)
               &((this->super_cmMakefileTargetGenerator).GlobalGenerator)->EmptyRuleHackDepends);
    if (local_288.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_308,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_288);
    }
    std::__cxx11::string::~string((string *)&local_288);
  }
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  os = (this->super_cmMakefileTargetGenerator).BuildFileStream._M_t.
       super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>.
       _M_t.
       super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
       super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (pcVar1,(ostream *)os,(char *)0x0,psVar6,&local_308,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2e8,true,false);
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  cmMakefileTargetGenerator::WriteTargetDriverRule
            (&this->super_cmMakefileTargetGenerator,psVar6,false);
  cmMakefileTargetGenerator::WriteTargetCleanRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetDependRules(&this->super_cmMakefileTargetGenerator);
  (*(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
    _vptr_cmCommonTargetGenerator[6])(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_308);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  return;
}

Assistant:

void cmMakefileUtilityTargetGenerator::WriteRuleFiles()
{
  this->CreateRuleFile();

  *this->BuildFileStream << "# Utility rule file for "
                         << this->GeneratorTarget->GetName() << ".\n\n";

  const char* root = (this->Makefile->IsOn("CMAKE_MAKE_INCLUDE_FROM_ROOT")
                        ? "$(CMAKE_BINARY_DIR)/"
                        : "");

  // Include the dependencies for the target.
  std::string dependFile =
    cmStrCat(this->TargetBuildDirectoryFull, "/compiler_depend.make");
  *this->BuildFileStream
    << "# Include any custom commands dependencies for this target.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator->MaybeRelativeToTopBinDir(dependFile))
    << "\n\n";
  if (!cmSystemTools::FileExists(dependFile)) {
    // Write an empty dependency file.
    cmGeneratedFileStream depFileStream(
      dependFile, false, this->GlobalGenerator->GetMakefileEncoding());
    depFileStream << "# Empty custom commands generated dependencies file for "
                  << this->GeneratorTarget->GetName() << ".\n"
                  << "# This may be replaced when dependencies are built.\n";
  }

  std::string dependTimestamp =
    cmStrCat(this->TargetBuildDirectoryFull, "/compiler_depend.ts");
  if (!cmSystemTools::FileExists(dependTimestamp)) {
    // Write a dependency timestamp file.
    cmGeneratedFileStream depFileStream(
      dependTimestamp, false, this->GlobalGenerator->GetMakefileEncoding());
    depFileStream << "# CMAKE generated file: DO NOT EDIT!\n"
                  << "# Timestamp file for custom commands dependencies "
                     "management for "
                  << this->GeneratorTarget->GetName() << ".\n";
  }

  if (!this->NoRuleMessages) {
    // Include the progress variables for the target.
    *this->BuildFileStream
      << "# Include the progress variables for this target.\n"
      << this->GlobalGenerator->IncludeDirective << " " << root
      << cmSystemTools::ConvertToOutputPath(
           this->LocalGenerator->MaybeRelativeToTopBinDir(
             this->ProgressFileNameFull))
      << "\n\n";
  }

  // write the custom commands for this target
  this->WriteTargetBuildRules();

  // Collect the commands and dependencies.
  std::vector<std::string> commands;
  std::vector<std::string> depends;

  // Utility targets store their rules in pre- and post-build commands.
  this->LocalGenerator->AppendCustomDepends(
    depends, this->GeneratorTarget->GetPreBuildCommands());

  this->LocalGenerator->AppendCustomDepends(
    depends, this->GeneratorTarget->GetPostBuildCommands());

  this->LocalGenerator->AppendCustomCommands(
    commands, this->GeneratorTarget->GetPreBuildCommands(),
    this->GeneratorTarget, this->LocalGenerator->GetBinaryDirectory());

  // Depend on all custom command outputs for sources
  this->DriveCustomCommands(depends);

  this->LocalGenerator->AppendCustomCommands(
    commands, this->GeneratorTarget->GetPostBuildCommands(),
    this->GeneratorTarget, this->LocalGenerator->GetBinaryDirectory());

  // Add dependencies on targets that must be built first.
  this->AppendTargetDepends(depends);

  // Add a dependency on the rule file itself.
  this->LocalGenerator->AppendRuleDepend(depends,
                                         this->BuildFileNameFull.c_str());

  // If the rule is empty add the special empty rule dependency needed
  // by some make tools.
  if (depends.empty() && commands.empty()) {
    std::string hack = this->GlobalGenerator->GetEmptyRuleHackDepends();
    if (!hack.empty()) {
      depends.push_back(std::move(hack));
    }
  }

  // Write the rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      this->GeneratorTarget->GetName(),
                                      depends, commands, true);

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(this->GeneratorTarget->GetName(), false);

  // Write clean target
  this->WriteTargetCleanRules();

  // Write the dependency generation rule.  This must be done last so
  // that multiple output pair information is available.
  this->WriteTargetDependRules();

  // close the streams
  this->CloseFileStreams();
}